

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O3

void __thiscall
glcts::ProgramUniformCase::activeUniformf
          (ProgramUniformCase *this,Functions *gl,int arraySize,int *location,float *value)

{
  GLfloat *pGVar1;
  
  (*gl->uniform1f)(*location,*value);
  (*gl->uniform2f)(location[1],value[1],value[2]);
  (*gl->uniform3f)(location[2],value[3],value[4],value[5]);
  (*gl->uniform4f)(location[3],value[6],value[7],value[8],value[9]);
  (*gl->uniform1fv)(location[4],arraySize,value + 10);
  pGVar1 = value + (long)arraySize + 10;
  (*gl->uniform2fv)(location[6],arraySize,pGVar1);
  (*gl->uniform3fv)(location[8],arraySize,pGVar1 + arraySize * 2);
  (*gl->uniform4fv)(location[10],arraySize,pGVar1 + arraySize * 2 + arraySize * 3);
  return;
}

Assistant:

void activeUniformf(const glw::Functions& gl, int arraySize, int* location, float* value)
	{
		gl.uniform1f(location[0], value[0]);
		value += 1;
		gl.uniform2f(location[1], value[0], value[1]);
		value += 2;
		gl.uniform3f(location[2], value[0], value[1], value[2]);
		value += 3;
		gl.uniform4f(location[3], value[0], value[1], value[2], value[3]);
		value += 4;

		gl.uniform1fv(location[4], arraySize, value);
		value += 1 * arraySize;
		gl.uniform2fv(location[6], arraySize, value);
		value += 2 * arraySize;
		gl.uniform3fv(location[8], arraySize, value);
		value += 3 * arraySize;
		gl.uniform4fv(location[10], arraySize, value);
	}